

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

void Frc_ManPrintStats(Frc_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Frc_Man_t *p_local;
  
  uVar1 = Frc_ManPiNum(p);
  uVar2 = Frc_ManPoNum(p);
  printf("i/o =%7d/%7d  ",(ulong)uVar1,(ulong)uVar2);
  iVar3 = Frc_ManRegNum(p);
  if (iVar3 != 0) {
    uVar1 = Frc_ManRegNum(p);
    printf("ff =%7d  ",(ulong)uVar1);
  }
  uVar1 = Frc_ManNodeNum(p);
  printf("node =%8d  ",(ulong)uVar1);
  uVar1 = Frc_ManObjNum(p);
  printf("obj =%8d  ",(ulong)uVar1);
  printf("mem =%5.2f MB",((double)p->nObjData * 4.0) / 1048576.0);
  printf("\n");
  return;
}

Assistant:

void Frc_ManPrintStats( Frc_Man_t * p )
{
//    if ( p->pName )
//        printf( "%8s : ", p->pName );
    printf( "i/o =%7d/%7d  ", Frc_ManPiNum(p), Frc_ManPoNum(p) );
    if ( Frc_ManRegNum(p) )
        printf( "ff =%7d  ", Frc_ManRegNum(p) );
    printf( "node =%8d  ", Frc_ManNodeNum(p) );
    printf( "obj =%8d  ", Frc_ManObjNum(p) );
//    printf( "lev =%5d  ", Frc_ManLevelNum(p) );
//    printf( "cut =%5d  ", Frc_ManCrossCut(p) );
    printf( "mem =%5.2f MB", 4.0*p->nObjData/(1<<20) );
//    printf( "obj =%5d  ", Frc_ManObjNum(p) );
    printf( "\n" );
}